

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O0

Vec_Ptr_t * Vec_PtrDup(Vec_Ptr_t *pVec)

{
  Vec_Ptr_t *pVVar1;
  void **local_20;
  Vec_Ptr_t *p;
  Vec_Ptr_t *pVec_local;
  
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nSize = pVec->nSize;
  pVVar1->nCap = pVec->nCap;
  if (pVVar1->nCap == 0) {
    local_20 = (void **)0x0;
  }
  else {
    local_20 = (void **)malloc((long)pVVar1->nCap << 3);
  }
  pVVar1->pArray = local_20;
  memcpy(pVVar1->pArray,pVec->pArray,(long)pVec->nSize << 3);
  return pVVar1;
}

Assistant:

static inline Vec_Ptr_t * Vec_PtrDup( Vec_Ptr_t * pVec )
{
    Vec_Ptr_t * p;
    p = ABC_ALLOC( Vec_Ptr_t, 1 );
    p->nSize  = pVec->nSize;
    p->nCap   = pVec->nCap;
    p->pArray = p->nCap? ABC_ALLOC( void *, p->nCap ) : NULL;
    memcpy( p->pArray, pVec->pArray, sizeof(void *) * (size_t)pVec->nSize );
    return p;
}